

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLElement::SetText(XMLElement *this,char *inText)

{
  XMLNode *pXVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLText *addThis;
  
  pXVar1 = (this->super_XMLNode)._firstChild;
  if (pXVar1 != (XMLNode *)0x0) {
    iVar2 = (*pXVar1->_vptr_XMLNode[1])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      StrPair::SetStr(&((this->super_XMLNode)._firstChild)->_value,inText,0);
      return;
    }
  }
  addThis = XMLDocument::NewText((this->super_XMLNode)._document,inText);
  XMLNode::InsertFirstChild(&this->super_XMLNode,&addThis->super_XMLNode);
  return;
}

Assistant:

void	XMLElement::SetText( const char* inText )
{
	if ( FirstChild() && FirstChild()->ToText() )
		FirstChild()->SetValue( inText );
	else {
		XMLText*	theText = GetDocument()->NewText( inText );
		InsertFirstChild( theText );
	}
}